

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
::streamReconstructedExpression
          (MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
           *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  string matcherAsString;
  char local_59;
  string local_58;
  string local_38;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            (&local_58,&this->m_matcher->super_MatcherUntypedBase);
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_38,this->m_arg);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_59 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58._M_string_length == DAT_00198c60) {
    if (local_58._M_string_length != 0) {
      iVar1 = bcmp(local_58._M_dataplus._M_p,Detail::unprintableString_abi_cxx11_,
                   local_58._M_string_length);
      if (iVar1 != 0) goto LAB_00147478;
    }
    std::ostream::write((char *)os,(long)(this->m_matcherString).m_start);
  }
  else {
LAB_00147478:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }